

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtVector3.h
# Opt level: O1

int bt_plane_clip_triangle
              (cbtVector4 *plane,cbtVector3 *point0,cbtVector3 *point1,cbtVector3 *point2,
              cbtVector3 *clipped)

{
  undefined8 *puVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  undefined1 auVar12 [16];
  float fVar13;
  
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(point0->m_floats[1] *
                                          (plane->super_cbtVector3).m_floats[1])),
                            ZEXT416((uint)point0->m_floats[0]),
                            ZEXT416((uint)(plane->super_cbtVector3).m_floats[0]));
  auVar10 = vfmadd132ss_fma(ZEXT416((uint)point0->m_floats[2]),auVar10,
                            ZEXT416((uint)(plane->super_cbtVector3).m_floats[2]));
  fVar2 = auVar10._0_4_ - (plane->super_cbtVector3).m_floats[3];
  bVar7 = fVar2 <= 1.1920929e-07;
  if (bVar7) {
    uVar4 = *(undefined8 *)(point0->m_floats + 2);
    *(undefined8 *)clipped->m_floats = *(undefined8 *)point0->m_floats;
    *(undefined8 *)(clipped->m_floats + 2) = uVar4;
  }
  uVar8 = (uint)bVar7;
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(point1->m_floats[1] *
                                          (plane->super_cbtVector3).m_floats[1])),
                            ZEXT416((uint)point1->m_floats[0]),
                            ZEXT416((uint)(plane->super_cbtVector3).m_floats[0]));
  auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)point1->m_floats[2]),
                            ZEXT416((uint)(plane->super_cbtVector3).m_floats[2]));
  fVar3 = auVar10._0_4_ - (plane->super_cbtVector3).m_floats[3];
  auVar10 = ZEXT416((uint)fVar2);
  auVar12 = SUB6416(ZEXT464(0x34000000),0);
  uVar4 = vcmpps_avx512vl(auVar12,auVar10,5);
  uVar5 = vcmpps_avx512vl(auVar12,ZEXT416((uint)fVar3),1);
  if ((((ushort)uVar4 ^ (ushort)uVar5) & 1) == 0) {
    auVar9._8_4_ = 0x80000000;
    auVar9._0_8_ = 0x8000000080000000;
    auVar9._12_4_ = 0x80000000;
    auVar9 = vxorps_avx512vl(auVar10,auVar9);
    fVar13 = auVar9._0_4_ / (fVar3 - fVar2);
    fVar11 = 1.0 - fVar13;
    auVar9 = vinsertps_avx(ZEXT416((uint)(fVar11 * point0->m_floats[0] +
                                         point1->m_floats[0] * fVar13)),
                           ZEXT416((uint)(fVar11 * point0->m_floats[1] +
                                         point1->m_floats[1] * fVar13)),0x10);
    auVar9 = vinsertps_avx(auVar9,ZEXT416((uint)(point1->m_floats[2] * fVar13 +
                                                fVar11 * point0->m_floats[2])),0x28);
    *(undefined1 (*) [16])clipped[bVar7].m_floats = auVar9;
    uVar8 = uVar8 + 1;
  }
  if (fVar3 <= 1.1920929e-07) {
    uVar4 = *(undefined8 *)(point1->m_floats + 2);
    puVar1 = (undefined8 *)((long)clipped->m_floats + (ulong)(uVar8 << 4));
    *puVar1 = *(undefined8 *)point1->m_floats;
    puVar1[1] = uVar4;
    uVar8 = uVar8 + 1;
  }
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(point2->m_floats[1] *
                                         (plane->super_cbtVector3).m_floats[1])),
                           ZEXT416((uint)point2->m_floats[0]),
                           ZEXT416((uint)(plane->super_cbtVector3).m_floats[0]));
  auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)point2->m_floats[2]),
                           ZEXT416((uint)(plane->super_cbtVector3).m_floats[2]));
  fVar11 = auVar9._0_4_ - (plane->super_cbtVector3).m_floats[3];
  uVar4 = vcmpps_avx512vl(auVar12,ZEXT416((uint)fVar3),5);
  uVar5 = vcmpps_avx512vl(auVar12,ZEXT416((uint)fVar11),1);
  if ((((ushort)uVar4 ^ (ushort)uVar5) & 1) == 0) {
    auVar6._8_4_ = 0x80000000;
    auVar6._0_8_ = 0x8000000080000000;
    auVar6._12_4_ = 0x80000000;
    auVar9 = vxorps_avx512vl(ZEXT416((uint)fVar3),auVar6);
    fVar13 = auVar9._0_4_ / (fVar11 - fVar3);
    fVar3 = 1.0 - fVar13;
    auVar9 = vinsertps_avx(ZEXT416((uint)(fVar3 * point1->m_floats[0] + point2->m_floats[0] * fVar13
                                         )),
                           ZEXT416((uint)(fVar3 * point1->m_floats[1] + point2->m_floats[1] * fVar13
                                         )),0x10);
    auVar9 = vinsertps_avx(auVar9,ZEXT416((uint)(point2->m_floats[2] * fVar13 +
                                                fVar3 * point1->m_floats[2])),0x28);
    *(undefined1 (*) [16])((long)clipped->m_floats + (ulong)(uVar8 << 4)) = auVar9;
    uVar8 = uVar8 + 1;
  }
  if (fVar11 <= 1.1920929e-07) {
    uVar4 = *(undefined8 *)(point2->m_floats + 2);
    puVar1 = (undefined8 *)((long)clipped->m_floats + (ulong)(uVar8 << 4));
    *puVar1 = *(undefined8 *)point2->m_floats;
    puVar1[1] = uVar4;
    uVar8 = uVar8 + 1;
  }
  uVar4 = vcmpps_avx512vl(auVar12,ZEXT416((uint)fVar11),5);
  uVar5 = vcmpps_avx512vl(auVar12,auVar10,1);
  if ((((ushort)uVar5 ^ (ushort)uVar4) & 1) == 0) {
    auVar10._8_4_ = 0x80000000;
    auVar10._0_8_ = 0x8000000080000000;
    auVar10._12_4_ = 0x80000000;
    auVar10 = vxorps_avx512vl(ZEXT416((uint)fVar11),auVar10);
    fVar11 = auVar10._0_4_ / (fVar2 - fVar11);
    fVar3 = 1.0 - fVar11;
    auVar10 = vinsertps_avx(ZEXT416((uint)(fVar3 * point2->m_floats[0] +
                                          fVar11 * point0->m_floats[0])),
                            ZEXT416((uint)(fVar3 * point2->m_floats[1] +
                                          fVar11 * point0->m_floats[1])),0x10);
    auVar10 = vinsertps_avx(auVar10,ZEXT416((uint)(fVar3 * point2->m_floats[2] +
                                                  fVar11 * point0->m_floats[2])),0x28);
    *(undefined1 (*) [16])((long)clipped->m_floats + (ulong)(uVar8 << 4)) = auVar10;
    uVar8 = uVar8 + 1;
  }
  if (fVar2 <= 1.1920929e-07) {
    uVar4 = *(undefined8 *)(point0->m_floats + 2);
    puVar1 = (undefined8 *)((long)clipped->m_floats + (ulong)(uVar8 << 4));
    *puVar1 = *(undefined8 *)point0->m_floats;
    puVar1[1] = uVar4;
    uVar8 = uVar8 + 1;
  }
  return uVar8;
}

Assistant:

SIMD_FORCE_INLINE cbtScalar dot(const cbtVector3& v) const
	{
#if defined BT_USE_SIMD_VECTOR3 && defined(BT_USE_SSE_IN_API) && defined(BT_USE_SSE)
		__m128 vd = _mm_mul_ps(mVec128, v.mVec128);
		__m128 z = _mm_movehl_ps(vd, vd);
		__m128 y = _mm_shuffle_ps(vd, vd, 0x55);
		vd = _mm_add_ss(vd, y);
		vd = _mm_add_ss(vd, z);
		return _mm_cvtss_f32(vd);
#elif defined(BT_USE_NEON)
		float32x4_t vd = vmulq_f32(mVec128, v.mVec128);
		float32x2_t x = vpadd_f32(vget_low_f32(vd), vget_low_f32(vd));
		x = vadd_f32(x, vget_high_f32(vd));
		return vget_lane_f32(x, 0);
#else
		return m_floats[0] * v.m_floats[0] +
			   m_floats[1] * v.m_floats[1] +
			   m_floats[2] * v.m_floats[2];
#endif
	}